

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

llm_graph_input_attn_cross * __thiscall
llm_graph_context::build_attn_inp_cross(llm_graph_context *this)

{
  llama_cross *plVar1;
  llm_graph_result *plVar2;
  uint32_t uVar3;
  tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> tVar4;
  long lVar5;
  long *plVar6;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_20;
  
  tVar4.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       operator_new(0x20);
  plVar1 = this->cross;
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
   super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl = &PTR__llm_graph_input_i_00286c00
  ;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = 0;
  *(llama_cross **)
   ((long)tVar4.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x18) = plVar1;
  if ((plVar1->v_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (plVar1->v_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar3 = this->hparams->n_ctx_train;
  }
  else {
    uVar3 = (uint32_t)plVar1->n_enc;
  }
  lVar5 = ggml_new_tensor_2d(this->ctx0,0,(long)(int)uVar3,
                             (long)this->n_tokens + 0x3fU & 0xffffffffffffffc0);
  plVar6 = (long *)((long)tVar4.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8);
  *plVar6 = lVar5;
  ggml_set_input(lVar5);
  if (this->cparams->flash_attn == true) {
    lVar5 = ggml_cast(this->ctx0,*plVar6,1);
  }
  else {
    lVar5 = *plVar6;
  }
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = lVar5;
  plVar2 = (this->res)._M_t.
           super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
           super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
           super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl;
  local_20._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       tVar4.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
       super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
  ::emplace_back<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>
            ((vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
              *)&plVar2->inputs,
             (unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)&local_20);
  tVar4.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> *)
        &(*(pointer *)
           ((long)&(plVar2->inputs).
                   super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
           + 8))[-1]._M_t.
         super___uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>;
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  return (llm_graph_input_attn_cross *)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         tVar4.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
         super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
}

Assistant:

llm_graph_input_attn_cross * llm_graph_context::build_attn_inp_cross() const {
    auto inp = std::make_unique<llm_graph_input_attn_cross>(cross);

    const int32_t n_enc = !cross->v_embd.empty() ? cross->n_enc : hparams.n_ctx_train;

    inp->cross_kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_enc, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    ggml_set_input(inp->cross_kq_mask);

    inp->cross_kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->cross_kq_mask, GGML_TYPE_F16) : inp->cross_kq_mask;

    return (llm_graph_input_attn_cross *) res->add_input(std::move(inp));
}